

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::TermPass1
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,MatchCharNode *deferredCharNode,
          bool *previousSurrogatePart)

{
  undefined1 *puVar1;
  Char *pCVar2;
  code *pcVar3;
  CharSet<char16_t> *pCVar4;
  CharSet<char16_t> *pCVar5;
  CountDomain CVar6;
  CountDomain CVar7;
  CountDomain CVar8;
  uint16 uVar9;
  undefined4 uVar10;
  bool bVar11;
  EncodedChar EVar12;
  CharCount CVar13;
  CharCountOrFlag CVar14;
  undefined4 *puVar15;
  EncodedChar *pEVar16;
  MatchCharNode *pMVar17;
  undefined7 extraout_var;
  Node *pNVar18;
  char *message;
  uint lineNumber;
  int iVar19;
  MatchCharNode *local_30;
  Node *node;
  
  ThreadContext::ProbeStackNoDispose
            (this->scriptContext->threadContext,0x6000,this->scriptContext,(PVOID)0x0);
  local_30 = (MatchCharNode *)0x0;
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                        ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar11) goto LAB_00ebd7e5;
    *puVar15 = 0;
  }
  pEVar16 = this->next;
  EVar12 = *pEVar16;
  if (0x3e < (ushort)EVar12) {
    switch(EVar12) {
    case L'[':
      if (this->inputLim < pEVar16 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar11) goto LAB_00ebd7e5;
        *puVar15 = 0;
      }
      pEVar16 = this->next;
      this->next = pEVar16 + 1;
      if (((this->unicodeFlagPresent == true) &&
          (this->currentSurrogatePairNode != (SurrogatePairTracker *)0x0)) &&
         (this->currentSurrogatePairNode->rangeLocation == pEVar16 + 1)) {
        local_30 = (MatchCharNode *)CharacterClassPass1<true>(this);
      }
      else {
        local_30 = (MatchCharNode *)CharacterClassPass1<false>(this);
      }
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar11) goto LAB_00ebd7e5;
        *puVar15 = 0;
      }
      if (*this->next != L']') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0x580,"(ECLookahead() == \']\')","ECLookahead() == \']\'");
        if (!bVar11) goto LAB_00ebd7e5;
        *puVar15 = 0;
      }
      if (this->inputLim < this->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar11) goto LAB_00ebd7e5;
        *puVar15 = 0;
      }
      this->next = this->next + 1;
      break;
    case L'\\':
      if (this->inputLim < pEVar16 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar11) goto LAB_00ebd7e5;
        *puVar15 = 0;
      }
      this->next = this->next + 1;
      bVar11 = SurrogatePairPass1(this,(Node **)&local_30,deferredCharNode,previousSurrogatePart);
      if ((!bVar11) &&
         (bVar11 = AtomEscapePass1(this,(Node **)&local_30,deferredCharNode,previousSurrogatePart),
         bVar11)) {
        return &local_30->super_Node;
      }
      break;
    case L']':
      goto switchD_00ebc497_caseD_5d;
    case L'^':
      if (this->inputLim < pEVar16 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar11) goto LAB_00ebd7e5;
        *puVar15 = 0;
      }
      this->next = this->next + 1;
      pNVar18 = (Node *)new<Memory::ArenaAllocator>(0x38,this->ctAllocator,0x366bee);
      pNVar18->tag = BOL;
      pNVar18->features = 0;
      goto LAB_00ebcb87;
    default:
      if (EVar12 == L'?') goto switchD_00ebc3f4_caseD_2a;
      if (EVar12 == L'|') goto switchD_00ebc3f4_caseD_29;
      goto switchD_00ebc3f4_caseD_25;
    }
    goto LAB_00ebcf7f;
  }
  switch(EVar12) {
  case L'$':
    if (this->inputLim < pEVar16 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar11) goto LAB_00ebd7e5;
      *puVar15 = 0;
    }
    this->next = this->next + 1;
    pNVar18 = (Node *)new<Memory::ArenaAllocator>(0x38,this->ctAllocator,0x366bee);
    pNVar18->tag = EOL;
    pNVar18->features = 0;
LAB_00ebcb87:
    *(uint *)&pNVar18->field_0xc = *(uint *)&pNVar18->field_0xc & 0xffff8000;
    pNVar18->firstSet = (CharSet<char16_t> *)0x0;
    pNVar18->followSet = (CharSet<char16_t> *)0x0;
    (pNVar18->prevConsumes).lower = 0;
    *(undefined8 *)&(pNVar18->prevConsumes).upper = 0xffffffff;
    *(undefined8 *)&(pNVar18->thisConsumes).upper = 0xffffffff;
    (pNVar18->followConsumes).upper = 0xffffffff;
    pNVar18->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558c50;
    return pNVar18;
  case L'%':
  case L'&':
  case L'\'':
  case L',':
  case L'-':
    goto switchD_00ebc3f4_caseD_25;
  case L'(':
    if (this->inputLim < pEVar16 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar11) goto LAB_00ebd7e5;
      *puVar15 = 0;
    }
    pEVar16 = this->next;
    this->next = pEVar16 + 1;
    if (this->inputLim < pEVar16 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar11) goto LAB_00ebd7e5;
      *puVar15 = 0;
    }
    if (*this->next == L'?') {
      if (this->inputLim < this->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar11) goto LAB_00ebd7e5;
        *puVar15 = 0;
      }
      EVar12 = this->next[1];
      if (EVar12 == L'!') {
        ECConsume(this,2);
        local_30 = (MatchCharNode *)DisjunctionPass1(this);
        EVar12 = ECLookahead(this,0);
        if (EVar12 != L')') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar15 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                              ,0x54f,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
          if (!bVar11) goto LAB_00ebd7e5;
          *puVar15 = 0;
        }
        ECConsume(this,1);
        pMVar17 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
        (pMVar17->super_Node).tag = Assertion;
        (pMVar17->super_Node).features = 0;
        puVar1 = &(pMVar17->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (pMVar17->super_Node).prevConsumes.lower = 0;
        (pMVar17->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (pMVar17->super_Node).followSet = (CharSet<char16_t> *)0x0;
        *(undefined8 *)&(pMVar17->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(pMVar17->super_Node).thisConsumes.upper = 0xffffffff;
        (pMVar17->super_Node).followConsumes.upper = 0xffffffff;
        (pMVar17->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559510;
        *(MatchCharNode **)pMVar17->cs = local_30;
        pMVar17->isEquivClass = true;
      }
      else {
        if (EVar12 == L':') {
          ECConsume(this,2);
          local_30 = (MatchCharNode *)DisjunctionPass1(this);
          EVar12 = ECLookahead(this,0);
          if (EVar12 != L')') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar15 = 1;
            bVar11 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0x556,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
            if (!bVar11) goto LAB_00ebd7e5;
            *puVar15 = 0;
          }
          ECConsume(this,1);
          break;
        }
        if (EVar12 != L'=') {
          iVar19 = this->nextGroupId;
          this->nextGroupId = iVar19 + 1;
          local_30 = (MatchCharNode *)DisjunctionPass1(this);
          EVar12 = ECLookahead(this,0);
          if (EVar12 != L')') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar15 = 1;
            bVar11 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0x55e,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
            if (!bVar11) goto LAB_00ebd7e5;
            *puVar15 = 0;
          }
          ECConsume(this,1);
          goto LAB_00ebcf11;
        }
        ECConsume(this,2);
        local_30 = (MatchCharNode *)DisjunctionPass1(this);
        EVar12 = ECLookahead(this,0);
        if (EVar12 != L')') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar15 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                              ,0x548,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
          if (!bVar11) goto LAB_00ebd7e5;
          *puVar15 = 0;
        }
        ECConsume(this,1);
        pMVar17 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
        (pMVar17->super_Node).tag = Assertion;
        (pMVar17->super_Node).features = 0;
        puVar1 = &(pMVar17->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (pMVar17->super_Node).prevConsumes.lower = 0;
        (pMVar17->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (pMVar17->super_Node).followSet = (CharSet<char16_t> *)0x0;
        *(undefined8 *)&(pMVar17->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(pMVar17->super_Node).thisConsumes.upper = 0xffffffff;
        (pMVar17->super_Node).followConsumes.upper = 0xffffffff;
        (pMVar17->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559510;
        *(MatchCharNode **)pMVar17->cs = local_30;
        pMVar17->isEquivClass = false;
      }
      *(undefined4 *)&pMVar17->field_0x44 = 0;
      local_30 = pMVar17;
    }
    else {
      iVar19 = this->nextGroupId;
      this->nextGroupId = iVar19 + 1;
      local_30 = (MatchCharNode *)DisjunctionPass1(this);
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar11) goto LAB_00ebd7e5;
        *puVar15 = 0;
      }
      if (*this->next != L')') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0x56a,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
        if (!bVar11) goto LAB_00ebd7e5;
        *puVar15 = 0;
      }
      if (this->inputLim < this->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar11) goto LAB_00ebd7e5;
        *puVar15 = 0;
      }
      this->next = this->next + 1;
LAB_00ebcf11:
      pMVar17 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x50,this->ctAllocator,0x366bee);
      (pMVar17->super_Node).tag = DefineGroup;
      (pMVar17->super_Node).features = 0;
      puVar1 = &(pMVar17->super_Node).field_0xc;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
      (pMVar17->super_Node).firstSet = (CharSet<char16_t> *)0x0;
      (pMVar17->super_Node).followSet = (CharSet<char16_t> *)0x0;
      (pMVar17->super_Node).prevConsumes.lower = 0;
      *(undefined8 *)&(pMVar17->super_Node).prevConsumes.upper = 0xffffffff;
      *(undefined8 *)&(pMVar17->super_Node).thisConsumes.upper = 0xffffffff;
      (pMVar17->super_Node).followConsumes.upper = 0xffffffff;
      (pMVar17->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559270;
      *(MatchCharNode **)pMVar17->cs = local_30;
      *(int *)&pMVar17->isEquivClass = iVar19;
      *(undefined4 *)&pMVar17->field_0x44 = 2;
      *(undefined1 *)&pMVar17[1].super_Node._vptr_Node = 0;
      local_30 = pMVar17;
    }
    break;
  case L')':
switchD_00ebc3f4_caseD_29:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    message = "false";
    lineNumber = 0x586;
    goto LAB_00ebc6e6;
  case L'*':
  case L'+':
switchD_00ebc3f4_caseD_2a:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    message = "Allowed only in the escaped form. These should be caught by TermPass0.";
    lineNumber = 0x592;
LAB_00ebc6e6:
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                        ,lineNumber,"(false)",message);
    if (!bVar11) goto LAB_00ebd7e5;
    *puVar15 = 0;
    break;
  case L'.':
    if (this->inputLim < pEVar16 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar11) goto LAB_00ebd7e5;
      *puVar15 = 0;
    }
    this->next = this->next + 1;
    local_30 = (MatchCharNode *)GetNodeWithValidCharacterSet(this,L'.');
    break;
  default:
    if ((EVar12 == L'\0') && (this->inputLim <= pEVar16)) {
      Fail(this,-0x7ff5ec67);
    }
switchD_00ebc3f4_caseD_25:
    bVar11 = SurrogatePairPass1(this,(Node **)&local_30,deferredCharNode,previousSurrogatePart);
    if (!bVar11) {
      pEVar16 = this->next;
switchD_00ebc497_caseD_5d:
      if (this->inputLim <= pEVar16) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0x25d,"(!IsEOF())","!IsEOF()");
        if (!bVar11) goto LAB_00ebd7e5;
        *puVar15 = 0;
      }
      pCVar2 = this->next;
      this->next = pCVar2 + 1;
      deferredCharNode->cs[0] = *pCVar2;
      local_30 = deferredCharNode;
    }
  }
LAB_00ebcf7f:
  if (local_30 == (MatchCharNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                        ,0x5a7,"(node != 0)","node != 0");
    if (!bVar11) goto LAB_00ebd7e5;
    *puVar15 = 0;
  }
  bVar11 = AtQuantifier(this);
  if (!bVar11) {
    return &local_30->super_Node;
  }
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                        ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar11) goto LAB_00ebd7e5;
    *puVar15 = 0;
  }
  EVar12 = *this->next;
  if ((ushort)EVar12 < 0x3f) {
    if (EVar12 == L'*') {
      if (local_30 == deferredCharNode) {
        local_30 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
        (local_30->super_Node)._vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_01558b88;
        uVar9 = (deferredCharNode->super_Node).features;
        uVar10 = *(undefined4 *)&(deferredCharNode->super_Node).field_0xc;
        pCVar4 = (deferredCharNode->super_Node).firstSet;
        pCVar5 = (deferredCharNode->super_Node).followSet;
        CVar6 = (deferredCharNode->super_Node).prevConsumes;
        CVar7 = (deferredCharNode->super_Node).thisConsumes;
        CVar8 = (deferredCharNode->super_Node).followConsumes;
        (local_30->super_Node).tag = (deferredCharNode->super_Node).tag;
        (local_30->super_Node).features = uVar9;
        *(undefined4 *)&(local_30->super_Node).field_0xc = uVar10;
        (local_30->super_Node).firstSet = pCVar4;
        (local_30->super_Node).followSet = pCVar5;
        (local_30->super_Node).prevConsumes = CVar6;
        (local_30->super_Node).thisConsumes = CVar7;
        (local_30->super_Node).followConsumes = CVar8;
        (local_30->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01558ef0;
        *(undefined8 *)local_30->cs = *(undefined8 *)deferredCharNode->cs;
        local_30->isEquivClass = deferredCharNode->isEquivClass;
      }
      if (this->inputLim < this->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar11) goto LAB_00ebd7e5;
        *puVar15 = 0;
      }
      this->next = this->next + 1;
      bVar11 = OptNonGreedy(this);
      CVar13 = 0;
    }
    else {
      if (EVar12 != L'+') goto LAB_00ebd3bb;
      if (local_30 == deferredCharNode) {
        local_30 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
        (local_30->super_Node)._vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_01558b88;
        uVar9 = (deferredCharNode->super_Node).features;
        uVar10 = *(undefined4 *)&(deferredCharNode->super_Node).field_0xc;
        pCVar4 = (deferredCharNode->super_Node).firstSet;
        pCVar5 = (deferredCharNode->super_Node).followSet;
        CVar6 = (deferredCharNode->super_Node).prevConsumes;
        CVar7 = (deferredCharNode->super_Node).thisConsumes;
        CVar8 = (deferredCharNode->super_Node).followConsumes;
        (local_30->super_Node).tag = (deferredCharNode->super_Node).tag;
        (local_30->super_Node).features = uVar9;
        *(undefined4 *)&(local_30->super_Node).field_0xc = uVar10;
        (local_30->super_Node).firstSet = pCVar4;
        (local_30->super_Node).followSet = pCVar5;
        (local_30->super_Node).prevConsumes = CVar6;
        (local_30->super_Node).thisConsumes = CVar7;
        (local_30->super_Node).followConsumes = CVar8;
        (local_30->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01558ef0;
        *(undefined8 *)local_30->cs = *(undefined8 *)deferredCharNode->cs;
        local_30->isEquivClass = deferredCharNode->isEquivClass;
      }
      if (this->inputLim < this->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar11) goto LAB_00ebd7e5;
        *puVar15 = 0;
      }
      this->next = this->next + 1;
      bVar11 = OptNonGreedy(this);
      CVar13 = 1;
    }
    CVar14 = 0xffffffff;
LAB_00ebd5e9:
    pMVar17 = (MatchCharNode *)NewLoopNode(this,CVar13,CVar14,bVar11,&local_30->super_Node);
    return &pMVar17->super_Node;
  }
  if (EVar12 == L'?') {
    if (local_30 == deferredCharNode) {
      local_30 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
      (local_30->super_Node)._vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_01558b88;
      uVar9 = (deferredCharNode->super_Node).features;
      uVar10 = *(undefined4 *)&(deferredCharNode->super_Node).field_0xc;
      pCVar4 = (deferredCharNode->super_Node).firstSet;
      pCVar5 = (deferredCharNode->super_Node).followSet;
      CVar6 = (deferredCharNode->super_Node).prevConsumes;
      CVar7 = (deferredCharNode->super_Node).thisConsumes;
      CVar8 = (deferredCharNode->super_Node).followConsumes;
      (local_30->super_Node).tag = (deferredCharNode->super_Node).tag;
      (local_30->super_Node).features = uVar9;
      *(undefined4 *)&(local_30->super_Node).field_0xc = uVar10;
      (local_30->super_Node).firstSet = pCVar4;
      (local_30->super_Node).followSet = pCVar5;
      (local_30->super_Node).prevConsumes = CVar6;
      (local_30->super_Node).thisConsumes = CVar7;
      (local_30->super_Node).followConsumes = CVar8;
      (local_30->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01558ef0;
      *(undefined8 *)local_30->cs = *(undefined8 *)deferredCharNode->cs;
      local_30->isEquivClass = deferredCharNode->isEquivClass;
    }
    if (this->inputLim < this->next + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar11) goto LAB_00ebd7e5;
      *puVar15 = 0;
    }
    this->next = this->next + 1;
    bVar11 = OptNonGreedy(this);
    CVar13 = 0;
    CVar14 = 1;
    goto LAB_00ebd5e9;
  }
  if (EVar12 == L'{') {
    if (local_30 == deferredCharNode) {
      local_30 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
      (local_30->super_Node)._vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_01558b88;
      uVar9 = (deferredCharNode->super_Node).features;
      uVar10 = *(undefined4 *)&(deferredCharNode->super_Node).field_0xc;
      pCVar4 = (deferredCharNode->super_Node).firstSet;
      pCVar5 = (deferredCharNode->super_Node).followSet;
      CVar6 = (deferredCharNode->super_Node).prevConsumes;
      CVar7 = (deferredCharNode->super_Node).thisConsumes;
      CVar8 = (deferredCharNode->super_Node).followConsumes;
      (local_30->super_Node).tag = (deferredCharNode->super_Node).tag;
      (local_30->super_Node).features = uVar9;
      *(undefined4 *)&(local_30->super_Node).field_0xc = uVar10;
      (local_30->super_Node).firstSet = pCVar4;
      (local_30->super_Node).followSet = pCVar5;
      (local_30->super_Node).prevConsumes = CVar6;
      (local_30->super_Node).thisConsumes = CVar7;
      (local_30->super_Node).followConsumes = CVar8;
      (local_30->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01558ef0;
      *(undefined8 *)local_30->cs = *(undefined8 *)deferredCharNode->cs;
      local_30->isEquivClass = deferredCharNode->isEquivClass;
    }
    if (this->inputLim < this->next + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar11) goto LAB_00ebd7e5;
      *puVar15 = 0;
    }
    this->next = this->next + 1;
    CVar13 = RepeatCount(this);
    if (this->inputLim < this->next) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar11) goto LAB_00ebd7e5;
      *puVar15 = 0;
    }
    pEVar16 = this->next;
    if (*pEVar16 == L'}') {
      if (this->inputLim < pEVar16 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar11) goto LAB_00ebd7e5;
        *puVar15 = 0;
      }
      this->next = this->next + 1;
      bVar11 = OptNonGreedy(this);
      CVar14 = CVar13;
    }
    else {
      if (*pEVar16 != L',') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0x5d7,"(false)","false");
        pNVar18 = (Node *)CONCAT71(extraout_var,bVar11);
        if (bVar11) {
          *puVar15 = 0;
          bVar11 = true;
          goto LAB_00ebd7c3;
        }
        goto LAB_00ebd7e5;
      }
      if (this->inputLim < pEVar16 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar11) goto LAB_00ebd7e5;
        *puVar15 = 0;
      }
      pEVar16 = this->next;
      this->next = pEVar16 + 1;
      if (this->inputLim < pEVar16 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar11) goto LAB_00ebd7e5;
        *puVar15 = 0;
      }
      if (*this->next == L'}') {
        ECConsume(this,1);
        bVar11 = OptNonGreedy(this);
        CVar14 = 0xffffffff;
      }
      else {
        CVar14 = RepeatCount(this);
        if (CVar14 < CVar13) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar15 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                              ,0x5ce,"(lower <= upper)","lower <= upper");
          if (!bVar11) goto LAB_00ebd7e5;
          *puVar15 = 0;
        }
        EVar12 = ECLookahead(this,0);
        if (EVar12 != L'}') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar15 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                              ,0x5cf,"(ECLookahead() == \'}\')","ECLookahead() == \'}\'");
          if (!bVar11) goto LAB_00ebd7e5;
          *puVar15 = 0;
        }
        ECConsume(this,1);
        bVar11 = OptNonGreedy(this);
      }
    }
    pNVar18 = NewLoopNode(this,CVar13,CVar14,bVar11,&local_30->super_Node);
    bVar11 = false;
LAB_00ebd7c3:
    if (bVar11) {
      return &local_30->super_Node;
    }
    return pNVar18;
  }
LAB_00ebd3bb:
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar15 = 1;
  bVar11 = Js::Throw::ReportAssert
                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                      ,0x5dd,"(false)","false");
  if (bVar11) {
    *puVar15 = 0;
    return &local_30->super_Node;
  }
LAB_00ebd7e5:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

Node* Parser<P, IsLiteral>::TermPass1(MatchCharNode* deferredCharNode, bool& previousSurrogatePart)
    {
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackRegex);

        Node* node = 0;
        bool containsSurrogatePair = false;
        switch (ECLookahead())
        {
        case '^':
            ECConsume();
            return Anew(ctAllocator, SimpleNode, Node::BOL); // No quantifier allowed
        case '$':
            ECConsume();
            return Anew(ctAllocator, SimpleNode, Node::EOL); // No quantifier allowed
        case '\\':
            ECConsume();
            if(SurrogatePairPass1(node, deferredCharNode, previousSurrogatePart))
            {
                break; // For quantifier
            }
            else if (AtomEscapePass1(node, deferredCharNode, previousSurrogatePart))
            {
                return node; // No quantifier allowed
            }
            break; // else: fall-through for opt quantifier
        case '(':
            ECConsume();
            switch (ECLookahead())
            {
            case '?':
                switch (ECLookahead(1))
                {
                case '=':
                    ECConsume(2); // ?=
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    node = Anew(ctAllocator, AssertionNode, false, node);
                    break; // As per Annex B, allow this to be quantifiable
                case '!':
                    ECConsume(2); // ?!
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    node = Anew(ctAllocator, AssertionNode, true, node);
                    break; // As per Annex B, allow this to be quantifiable
                case ':':
                    ECConsume(2); // ?:
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    break; // fall-through for opt quantifier
                default:
                    {
                        // ? not yet consumed
                        int thisGroupId = nextGroupId++;
                        node = DisjunctionPass1();
                        Assert(ECLookahead() == ')');
                        ECConsume(); // )
                        node = Anew(ctAllocator, DefineGroupNode, thisGroupId, node);
                        break; // fall-through for opt quantifier
                    }
                }
                break;
            default:
                {
                    // next char not yet consumed
                    int thisGroupId = nextGroupId++;
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    node = Anew(ctAllocator, DefineGroupNode, thisGroupId, node);
                    break; // fall-through for opt quantifier
                }
            }
            break;
        case '.':
            {
                ECConsume();
                node = GetNodeWithValidCharacterSet('.');
                break; // fall-through for opt quantifier
            }
        case '[':
            ECConsume();
            if (unicodeFlagPresent)
            {
                containsSurrogatePair = this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->rangeLocation == next;
            }

            node = containsSurrogatePair ? CharacterClassPass1<true>() : CharacterClassPass1<false>();

            Assert(ECLookahead() == ']');
            ECConsume(); // ]
            break; // fall-through for opt quantifier
#if DBG
        case ')':
        case '|':
            Assert(false);
            break;
#endif
        case ']':
            // SPEC DEVIATION: This should be syntax error, instead accept as itself
            deferredCharNode->cs[0] = NextChar();
            node = deferredCharNode;
            break; // fall-through for opt quantifier
#if DBG
        case '*':
        case '+':
        case '?':
            AssertMsg(false, "Allowed only in the escaped form. These should be caught by TermPass0.");
            break;
#endif
        case 0:
            if (IsEOF())
                // Terminating 0
                Fail(JSERR_RegExpSyntax);
            // else fall-through for embedded 0
        default:
            if(SurrogatePairPass1(node, deferredCharNode, previousSurrogatePart))
            {
                break; //For quantifier
            }
            else
            {
                deferredCharNode->cs[0] = NextChar();
                node = deferredCharNode;
                break; // fall-through for opt quantifier
            }
        }

        Assert(node != 0);

        if (AtQuantifier())
        {
            switch (ECLookahead())
            {
            case '*':
                if (node == deferredCharNode)
                    node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                ECConsume();
                return NewLoopNode(0, CharCountFlag, OptNonGreedy(), node);
            case '+':
                if (node == deferredCharNode)
                    node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                ECConsume();
                return NewLoopNode(1, CharCountFlag, OptNonGreedy(), node);
            case '?':
                if (node == deferredCharNode)
                    node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                ECConsume();
                return NewLoopNode(0, 1, OptNonGreedy(), node);
            case '{':
                {
                    if (node == deferredCharNode)
                        node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                    ECConsume();
                    CharCount lower = RepeatCount();
                    switch (ECLookahead())
                    {
                    case ',':
                        ECConsume();
                        if (ECLookahead() == '}')
                        {
                            ECConsume();
                            return NewLoopNode(lower, CharCountFlag, OptNonGreedy(), node);
                        }
                        else
                        {
                            CharCount upper = RepeatCount();
                            Assert(lower <= upper);
                            Assert(ECLookahead() == '}');
                            ECConsume(); // }
                            return NewLoopNode(lower, upper, OptNonGreedy(), node);
                        }
                    case '}':
                        ECConsume();
                        return NewLoopNode(lower, lower, OptNonGreedy(), node);
                    default:
                        Assert(false);
                        break;
                    }
                    break;
                }
            default:
                Assert(false);
                break;
            }
        }

        return node;
    }